

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void walMerge(u32 *aContent,ht_slot *aLeft,int nLeft,ht_slot **paRight,int *pnRight,ht_slot *aTmp)

{
  int iVar1;
  u32 uVar2;
  ht_slot *phVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ushort *puVar10;
  
  iVar1 = *pnRight;
  bVar4 = 0 < iVar1;
  bVar5 = 0 < nLeft;
  lVar6 = 0;
  if (bVar4 || bVar5) {
    phVar3 = *paRight;
    lVar6 = 0;
    iVar8 = 0;
    iVar7 = 0;
    do {
      if ((!bVar5) || ((bVar4 && (aContent[phVar3[iVar7]] <= aContent[aLeft[iVar8]])))) {
        lVar9 = (long)iVar7;
        iVar7 = iVar7 + 1;
        puVar10 = phVar3 + lVar9;
      }
      else {
        puVar10 = aLeft + iVar8;
        iVar8 = iVar8 + 1;
      }
      uVar2 = aContent[*puVar10];
      aTmp[lVar6] = *puVar10;
      if (iVar8 < nLeft) {
        iVar8 = iVar8 + (uint)(aContent[aLeft[iVar8]] == uVar2);
      }
      bVar5 = iVar8 < nLeft;
      lVar6 = lVar6 + 1;
      bVar4 = iVar7 < iVar1;
    } while ((iVar7 < iVar1) || (iVar8 < nLeft));
  }
  *paRight = aLeft;
  *pnRight = (int)lVar6;
  memcpy(aLeft,aTmp,(ulong)(uint)((int)lVar6 * 2));
  return;
}

Assistant:

static void walMerge(
  const u32 *aContent,            /* Pages in wal - keys for the sort */
  ht_slot *aLeft,                 /* IN: Left hand input list */
  int nLeft,                      /* IN: Elements in array *paLeft */
  ht_slot **paRight,              /* IN/OUT: Right hand input list */
  int *pnRight,                   /* IN/OUT: Elements in *paRight */
  ht_slot *aTmp                   /* Temporary buffer */
){
  int iLeft = 0;                  /* Current index in aLeft */
  int iRight = 0;                 /* Current index in aRight */
  int iOut = 0;                   /* Current index in output buffer */
  int nRight = *pnRight;
  ht_slot *aRight = *paRight;

  assert( nLeft>0 && nRight>0 );
  while( iRight<nRight || iLeft<nLeft ){
    ht_slot logpage;
    Pgno dbpage;

    if( (iLeft<nLeft)
     && (iRight>=nRight || aContent[aLeft[iLeft]]<aContent[aRight[iRight]])
    ){
      logpage = aLeft[iLeft++];
    }else{
      logpage = aRight[iRight++];
    }
    dbpage = aContent[logpage];

    aTmp[iOut++] = logpage;
    if( iLeft<nLeft && aContent[aLeft[iLeft]]==dbpage ) iLeft++;

    assert( iLeft>=nLeft || aContent[aLeft[iLeft]]>dbpage );
    assert( iRight>=nRight || aContent[aRight[iRight]]>dbpage );
  }

  *paRight = aLeft;
  *pnRight = iOut;
  memcpy(aLeft, aTmp, sizeof(aTmp[0])*iOut);
}